

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

void Saig_SynchInitRegsBinary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCis;
    iVar7 = 0;
    do {
      uVar8 = pAig->nTruePis + iVar7;
      if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) {
LAB_006ee179:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar2->pArray[uVar8];
      iVar1 = *(int *)((long)pvVar3 + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006ee179;
      if (0 < nWords) {
        pvVar4 = vSimInfo->pArray[iVar1];
        uVar5 = 0;
        do {
          uVar6 = 0x55555555;
          if ((*(byte *)((long)pvVar3 + 0x18) & 0x10) == 0) {
            uVar6 = 0;
          }
          *(undefined4 *)((long)pvVar4 + uVar5 * 4) = uVar6;
          uVar5 = uVar5 + 1;
        } while ((uint)nWords != uVar5);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < pAig->nRegs);
  }
  return;
}

Assistant:

void Saig_SynchInitRegsBinary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pObj->fMarkA );
    }
}